

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

any * Omega_h::anon_unknown_41::lt(any *__return_storage_ptr__,any *lhs,any *rhs)

{
  bool bVar1;
  type_info *ptVar2;
  ParserFail *this;
  double dVar3;
  double dVar4;
  allocator local_89;
  string local_88 [48];
  Read<double> local_58;
  Read<double> local_48;
  Read<signed_char> local_38;
  bool local_21;
  any *local_20;
  any *rhs_local;
  any *lhs_local;
  
  local_20 = rhs;
  rhs_local = lhs;
  lhs_local = __return_storage_ptr__;
  ptVar2 = any::type(lhs);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&double::typeinfo);
  if (bVar1) {
    dVar3 = any_cast<double>(rhs_local);
    dVar4 = any_cast<double>(local_20);
    local_21 = dVar3 < dVar4;
    any::any<bool,void>(__return_storage_ptr__,&local_21);
  }
  else {
    ptVar2 = any::type(rhs_local);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
    if (!bVar1) {
      this = (ParserFail *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"Invalid operand types to < operator",&local_89);
      ParserFail::ParserFail(this,(string *)local_88);
      __cxa_throw(this,&ParserFail::typeinfo,ParserFail::~ParserFail);
    }
    any_cast<Omega_h::Read<double>>((Omega_h *)&local_48,rhs_local);
    any_cast<Omega_h::Read<double>>((Omega_h *)&local_58,local_20);
    lt_each<double>((Omega_h *)&local_38,&local_48,&local_58);
    any::any<Omega_h::Read<signed_char>,void>(__return_storage_ptr__,&local_38);
    Read<signed_char>::~Read(&local_38);
    Read<double>::~Read(&local_58);
    Read<double>::~Read(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

any lt(any& lhs, any& rhs) {
  if (lhs.type() == typeid(Real)) {
    return any_cast<Real>(lhs) < any_cast<Real>(rhs);
  } else if (lhs.type() == typeid(Reals)) {
    return lt_each(any_cast<Reals>(lhs), any_cast<Reals>(rhs));
  } else {
    throw ParserFail("Invalid operand types to < operator");
  }
}